

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

void __thiscall
GenericModel::multiData(GenericModel *this,QModelIndex *index,QModelRoleDataSpan roleDataSpan)

{
  int iVar1;
  GenericModelPrivate *this_00;
  GenericModelItem *pGVar2;
  QModelRoleData *pQVar3;
  long lVar4;
  int local_7c;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  QVariant local_50;
  
  pQVar3 = roleDataSpan.m_modelRoleData;
  this_00 = this->m_dptr;
  pGVar2 = GenericModelPrivate::itemForIndex(this_00,index);
  for (lVar4 = roleDataSpan.m_len * 0x28; lVar4 != 0; lVar4 = lVar4 + -0x28) {
    iVar1 = *(int *)pQVar3;
    local_7c = iVar1;
    if (this_00->m_mergeDisplayEdit != false) {
      local_7c = 0;
    }
    if (iVar1 != 2) {
      local_7c = iVar1;
    }
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0;
    local_60 = 2;
    QMap<int,_QVariant>::value(&local_50,&pGVar2->data,&local_7c,(QVariant *)&local_78);
    ::QVariant::operator=((QVariant *)(pQVar3 + 8),&local_50);
    ::QVariant::~QVariant(&local_50);
    ::QVariant::~QVariant((QVariant *)&local_78);
    pQVar3 = pQVar3 + 0x28;
  }
  return;
}

Assistant:

void GenericModel::multiData(const QModelIndex &index, QModelRoleDataSpan roleDataSpan) const
{
    Q_ASSERT(index.isValid() && index.model() == this);
    Q_D(const GenericModel);
    const GenericModelItem *const item = d->itemForIndex(index);
    for (QModelRoleData &roleData : roleDataSpan) {
        int role = roleData.role();
        if (d->m_mergeDisplayEdit && role == Qt::EditRole)
            role = Qt::DisplayRole;
        roleData.setData(item->data.value(role));
    }
}